

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O0

void __thiscall duckdb::ByteStreamSplitDecoder::InitializePage(ByteStreamSplitDecoder *this)

{
  ResizeableBuffer *increment;
  ByteBuffer *in_RDI;
  shared_ptr<duckdb::ResizeableBuffer,_true> *block;
  idx_t *args_1;
  ByteBuffer *args;
  
  args_1 = &(((original *)&in_RDI->ptr)->
            super___shared_ptr<duckdb::ResizeableBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
            allocated_data.allocated_size;
  args = in_RDI;
  increment = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
                        ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_RDI);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_RDI);
  make_uniq<duckdb::BssDecoder,unsigned_char*&,unsigned_long>(&args->ptr,args_1);
  unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::operator=
            ((unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true> *)in_RDI
             ,(unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true> *)
              increment);
  unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true> *)
             0x23f90c4);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_RDI);
  shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
            ((shared_ptr<duckdb::ResizeableBuffer,_true> *)in_RDI);
  ByteBuffer::inc(in_RDI,(uint64_t)increment);
  return;
}

Assistant:

void ByteStreamSplitDecoder::InitializePage() {
	auto &block = reader.block;
	// Subtract 1 from length as the block is allocated with 1 extra byte,
	// but the byte stream split encoder needs to know the correct data size.
	bss_decoder = make_uniq<BssDecoder>(block->ptr, block->len - 1);
	block->inc(block->len);
}